

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,StringTree *params,
          ArrayPtr<const_char> *params_1,StringTree *params_2,ArrayPtr<const_char> *params_3)

{
  char *pcVar1;
  Branch *pBVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  Branch *pBVar5;
  char *pcVar6;
  String local_50;
  StringTree *local_38;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  pcVar6 = (params_2->text).content.ptr;
  pcVar1 = (params->text).content.ptr;
  __return_storage_ptr__->size_ =
       (size_t)(params_1->ptr + (long)(pcVar1 + (long)pcVar6 + this->size_));
  heapString(&local_50,(size_t)(pcVar1 + (long)pcVar6));
  (__return_storage_ptr__->text).content.ptr = local_50.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_50.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_50.content.disposer;
  local_38 = (StringTree *)params_1;
  pBVar5 = (Branch *)
           _::HeapArrayDisposer::allocateImpl
                     (0x40,2,2,_::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>
                               ::construct,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      destruct);
  local_50.content.size_ = 2;
  local_50.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar2 = (__return_storage_ptr__->branches).ptr;
  local_50.content.ptr = (char *)pBVar5;
  if (pBVar2 != (Branch *)0x0) {
    sVar3 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar4 = (__return_storage_ptr__->branches).disposer;
    (*(code *)**(undefined8 **)pAVar4)
              (pAVar4,pBVar2,0x40,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = pBVar5;
  (__return_storage_ptr__->branches).size_ = 2;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pcVar6 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar6 != (char *)0x0) {
    pcVar6 = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pcVar6,0,this,(ArrayPtr<const_char> *)params,local_38,
             (ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}